

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O3

void do_cmd_wiz_summon_random(command *cmd)

{
  wchar_t wVar1;
  source sVar2;
  source origin;
  wchar_t local_1c;
  
  wVar1 = cmd_get_arg_number((command_conflict *)cmd,"quantity",&local_1c);
  if (wVar1 != L'\0') {
    wVar1 = get_quantity("How many monsters? ",L'(');
    local_1c = L'\x01';
    if (L'\x01' < wVar1) {
      local_1c = wVar1;
    }
    cmd_set_arg_number((command_conflict *)cmd,"quantity",local_1c);
  }
  if (L'\0' < local_1c) {
    wVar1 = L'\0';
    do {
      sVar2 = source_player();
      origin.which = sVar2.which;
      origin._4_4_ = 0;
      origin.what = sVar2.what;
      effect_simple(L'6',origin,"1",L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
      wVar1 = wVar1 + L'\x01';
    } while (wVar1 < local_1c);
  }
  return;
}

Assistant:

void do_cmd_wiz_summon_random(struct command *cmd)
{
	int n, i;

	if (cmd_get_arg_number(cmd, "quantity", &n) != CMD_OK) {
		n = get_quantity("How many monsters? ", 40);
		if (n < 1) n = 1;
		cmd_set_arg_number(cmd, "quantity", n);
	}

	for (i = 0; i < n; i++) {
		effect_simple(EF_SUMMON, source_player(), "1",
			0, 0, 0, 0, 0, NULL);
	}
}